

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IT8951.c
# Opt level: O1

void IT8951HostAreaPackedPixelWrite(IT8951LdImgInfo *pstLdImgInfo,IT8951AreaImgInfo *pstAreaImgInfo)

{
  uint uVar1;
  uint uVar2;
  uint16_t *puVar3;
  
  puVar3 = (uint16_t *)(ulong)pstLdImgInfo->ulStartFBAddr;
  IT8951SetImgBufBaseAddr(pstLdImgInfo->ulImgBufBaseAddr);
  IT8951LoadImgAreaStart(pstLdImgInfo,pstAreaImgInfo);
  if (pstAreaImgInfo->usHeight != 0) {
    uVar1 = 0;
    do {
      if (1 < pstAreaImgInfo->usWidth) {
        uVar2 = 0;
        do {
          LCDWriteData(*puVar3);
          puVar3 = puVar3 + 1;
          uVar2 = uVar2 + 1;
        } while (uVar2 < pstAreaImgInfo->usWidth >> 1);
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 < pstAreaImgInfo->usHeight);
  }
  LCDWriteCmdCode(0x22);
  return;
}

Assistant:

void IT8951HostAreaPackedPixelWrite(IT8951LdImgInfo* pstLdImgInfo,IT8951AreaImgInfo* pstAreaImgInfo)
{
	uint32_t i,j;
	//Source buffer address of Host
	uint16_t* pusFrameBuf = (uint16_t*)pstLdImgInfo->ulStartFBAddr;

	//Set Image buffer(IT8951) Base address
	IT8951SetImgBufBaseAddr(pstLdImgInfo->ulImgBufBaseAddr);
	//Send Load Image start Cmd
	IT8951LoadImgAreaStart(pstLdImgInfo , pstAreaImgInfo);
	//Host Write Data
	for(j=0;j< pstAreaImgInfo->usHeight;j++)
	{
		 for(i=0;i< pstAreaImgInfo->usWidth/2;i++)
			{
					//Write a Word(2-Bytes) for each time
					LCDWriteData(*pusFrameBuf);
					pusFrameBuf++;
			}
	}
	//Send Load Img End Command
	IT8951LoadImgEnd();
}